

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O3

void rtcForwardOccluded8Ex
               (int *valid,RTCOccludedFunctionNArguments *args,RTCScene hscene,RTCRay8 *iray,
               uint instID,uint instPrimID)

{
  RTCRayQueryContext *pRVar1;
  RTCRayN *pRVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  Scene *scene;
  RayQueryContext context;
  
  pRVar1 = args->context;
  pRVar2 = args->ray;
  uVar6 = *(undefined8 *)pRVar2;
  uVar7 = *(undefined8 *)(pRVar2 + 8);
  uVar8 = *(undefined8 *)(pRVar2 + 0x10);
  uVar9 = *(undefined8 *)(pRVar2 + 0x18);
  uVar10 = *(undefined8 *)(pRVar2 + 0x20);
  uVar11 = *(undefined8 *)(pRVar2 + 0x28);
  uVar12 = *(undefined8 *)(pRVar2 + 0x30);
  uVar13 = *(undefined8 *)(pRVar2 + 0x38);
  uVar14 = *(undefined8 *)(pRVar2 + 0x40);
  uVar15 = *(undefined8 *)(pRVar2 + 0x48);
  uVar16 = *(undefined8 *)(pRVar2 + 0x50);
  uVar17 = *(undefined8 *)(pRVar2 + 0x58);
  uVar18 = *(undefined8 *)(pRVar2 + 0x80);
  uVar19 = *(undefined8 *)(pRVar2 + 0x88);
  uVar20 = *(undefined8 *)(pRVar2 + 0x90);
  uVar21 = *(undefined8 *)(pRVar2 + 0x98);
  uVar22 = *(undefined8 *)(pRVar2 + 0xa0);
  uVar23 = *(undefined8 *)(pRVar2 + 0xa8);
  uVar24 = *(undefined8 *)(pRVar2 + 0xb0);
  uVar25 = *(undefined8 *)(pRVar2 + 0xb8);
  uVar26 = *(undefined8 *)(pRVar2 + 0xc0);
  uVar27 = *(undefined8 *)(pRVar2 + 200);
  uVar28 = *(undefined8 *)(pRVar2 + 0xd0);
  uVar29 = *(undefined8 *)(pRVar2 + 0xd8);
  uVar30 = *(undefined8 *)(iray->org_x + 2);
  *(undefined8 *)pRVar2 = *(undefined8 *)iray->org_x;
  *(undefined8 *)(pRVar2 + 8) = uVar30;
  uVar30 = *(undefined8 *)(iray->org_x + 6);
  *(undefined8 *)(pRVar2 + 0x10) = *(undefined8 *)(iray->org_x + 4);
  *(undefined8 *)(pRVar2 + 0x18) = uVar30;
  uVar30 = *(undefined8 *)(iray->org_y + 2);
  *(undefined8 *)(pRVar2 + 0x20) = *(undefined8 *)iray->org_y;
  *(undefined8 *)(pRVar2 + 0x28) = uVar30;
  uVar30 = *(undefined8 *)(iray->org_y + 6);
  *(undefined8 *)(pRVar2 + 0x30) = *(undefined8 *)(iray->org_y + 4);
  *(undefined8 *)(pRVar2 + 0x38) = uVar30;
  uVar30 = *(undefined8 *)(iray->org_z + 2);
  *(undefined8 *)(pRVar2 + 0x40) = *(undefined8 *)iray->org_z;
  *(undefined8 *)(pRVar2 + 0x48) = uVar30;
  uVar30 = *(undefined8 *)(iray->org_z + 6);
  *(undefined8 *)(pRVar2 + 0x50) = *(undefined8 *)(iray->org_z + 4);
  *(undefined8 *)(pRVar2 + 0x58) = uVar30;
  uVar30 = *(undefined8 *)(iray->dir_x + 2);
  *(undefined8 *)(pRVar2 + 0x80) = *(undefined8 *)iray->dir_x;
  *(undefined8 *)(pRVar2 + 0x88) = uVar30;
  uVar30 = *(undefined8 *)(iray->dir_x + 6);
  *(undefined8 *)(pRVar2 + 0x90) = *(undefined8 *)(iray->dir_x + 4);
  *(undefined8 *)(pRVar2 + 0x98) = uVar30;
  uVar30 = *(undefined8 *)(iray->dir_y + 2);
  *(undefined8 *)(pRVar2 + 0xa0) = *(undefined8 *)iray->dir_y;
  *(undefined8 *)(pRVar2 + 0xa8) = uVar30;
  uVar30 = *(undefined8 *)(iray->dir_y + 6);
  *(undefined8 *)(pRVar2 + 0xb0) = *(undefined8 *)(iray->dir_y + 4);
  *(undefined8 *)(pRVar2 + 0xb8) = uVar30;
  uVar30 = *(undefined8 *)(iray->dir_z + 2);
  *(undefined8 *)(pRVar2 + 0xc0) = *(undefined8 *)iray->dir_z;
  *(undefined8 *)(pRVar2 + 200) = uVar30;
  fVar3 = iray->dir_z[5];
  fVar4 = iray->dir_z[6];
  fVar5 = iray->dir_z[7];
  *(float *)(pRVar2 + 0xd0) = iray->dir_z[4];
  *(float *)(pRVar2 + 0xd4) = fVar3;
  *(float *)(pRVar2 + 0xd8) = fVar4;
  *(float *)(pRVar2 + 0xdc) = fVar5;
  context.args = *(RTCIntersectArguments **)&args[1].primID;
  if (pRVar1->instID[0] == 0xffffffff) {
    pRVar1->instID[0] = instID;
    pRVar1->instPrimID[0] = instPrimID;
  }
  context.scene = (Scene *)hscene;
  context.user = pRVar1;
  (**(code **)(hscene + 0xe8))(valid,hscene + 0x58,pRVar2,&context);
  pRVar1->instID[0] = 0xffffffff;
  pRVar1->instPrimID[0] = 0xffffffff;
  *(undefined8 *)pRVar2 = uVar6;
  *(undefined8 *)(pRVar2 + 8) = uVar7;
  *(undefined8 *)(pRVar2 + 0x10) = uVar8;
  *(undefined8 *)(pRVar2 + 0x18) = uVar9;
  *(undefined8 *)(pRVar2 + 0x20) = uVar10;
  *(undefined8 *)(pRVar2 + 0x28) = uVar11;
  *(undefined8 *)(pRVar2 + 0x30) = uVar12;
  *(undefined8 *)(pRVar2 + 0x38) = uVar13;
  *(undefined8 *)(pRVar2 + 0x40) = uVar14;
  *(undefined8 *)(pRVar2 + 0x48) = uVar15;
  *(undefined8 *)(pRVar2 + 0x50) = uVar16;
  *(undefined8 *)(pRVar2 + 0x58) = uVar17;
  *(undefined8 *)(pRVar2 + 0x80) = uVar18;
  *(undefined8 *)(pRVar2 + 0x88) = uVar19;
  *(undefined8 *)(pRVar2 + 0x90) = uVar20;
  *(undefined8 *)(pRVar2 + 0x98) = uVar21;
  *(undefined8 *)(pRVar2 + 0xa0) = uVar22;
  *(undefined8 *)(pRVar2 + 0xa8) = uVar23;
  *(undefined8 *)(pRVar2 + 0xb0) = uVar24;
  *(undefined8 *)(pRVar2 + 0xb8) = uVar25;
  *(undefined8 *)(pRVar2 + 0xc0) = uVar26;
  *(undefined8 *)(pRVar2 + 200) = uVar27;
  *(undefined8 *)(pRVar2 + 0xd0) = uVar28;
  *(undefined8 *)(pRVar2 + 0xd8) = uVar29;
  return;
}

Assistant:

RTC_API void rtcForwardOccluded8Ex(const int* valid, const RTCOccludedFunctionNArguments* args, RTCScene hscene, RTCRay8* iray, unsigned int instID, unsigned int instPrimID)
  {
    Scene* scene = (Scene*) hscene;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcForwardOccluded8Ex);
    rtcForwardOccludedN<RTCRay8,8>(valid, args, hscene, iray, instID, instPrimID);
    RTC_CATCH_END2(scene);
  }